

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O0

void __thiscall AviWriter::useFrame(AviWriter *this,avi_frame_t *frame)

{
  int iVar1;
  uint uVar2;
  uint *local_50;
  value_type pAStack_38;
  int testIndex;
  AVIIndexRecord *indexRecord;
  uint local_28;
  uint subsessionTag;
  uint bytePerSeconds_1;
  int uSecondsDiff_1;
  uint bytePerSeconds;
  int uSecondsDiff;
  avi_frame_t *frame_local;
  AviWriter *this_local;
  
  if (frame->type == 'A') {
    if (this->fPrevAudioPts != 0) {
      uSecondsDiff_1 = (int)frame->pts - (int)this->fPrevAudioPts;
      bytePerSeconds_1 = (uint)(long)(((double)frame->size * 1000000.0) / (double)uSecondsDiff_1);
      if (this->fAudioMaxBytesPerSecond < bytePerSeconds_1) {
        this->fAudioMaxBytesPerSecond = bytePerSeconds_1;
      }
    }
    this->fPrevAudioPts = frame->pts;
  }
  else {
    if (this->fPrevVideoPts != 0) {
      subsessionTag = (int)frame->pts - (int)this->fPrevVideoPts;
      local_28 = (uint)(long)(((double)frame->size * 1000000.0) / (double)(int)subsessionTag);
      if (this->fVideoMaxBytesPerSecond < local_28) {
        this->fVideoMaxBytesPerSecond = local_28;
      }
    }
    this->fPrevVideoPts = frame->pts;
  }
  indexRecord._4_4_ = 0x63643030;
  if (frame->type == 'A') {
    indexRecord._4_4_ = 0x62773130;
  }
  _bytePerSeconds = frame;
  frame_local = (avi_frame_t *)this;
  pAStack_38 = (value_type)operator_new(0x10);
  pAStack_38->fChunkId = indexRecord._4_4_;
  iVar1 = 4;
  if (_bytePerSeconds->type == 'A') {
    iVar1 = 0;
  }
  uVar2 = 0;
  if (_bytePerSeconds->data[iVar1] == 'g') {
    uVar2 = 0x10;
  }
  pAStack_38->fFlags = uVar2;
  pAStack_38->fOffset = this->fNumBytesWritten + 4;
  pAStack_38->fSize = _bytePerSeconds->size;
  std::queue<AVIIndexRecord_*,_std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>_>::
  push(&this->indexRecords,&stack0xffffffffffffffc8);
  uVar2 = addWord(this,indexRecord._4_4_);
  this->fNumBytesWritten = uVar2 + this->fNumBytesWritten;
  uVar2 = addWord(this,_bytePerSeconds->size);
  this->fNumBytesWritten = uVar2 + this->fNumBytesWritten;
  fwrite(_bytePerSeconds->data,1,(long)_bytePerSeconds->size,(FILE *)this->fOutFid);
  this->fNumBytesWritten = _bytePerSeconds->size + this->fNumBytesWritten;
  if (_bytePerSeconds->size % 2 == 0) {
    uVar2 = addByte(this,'\0');
    this->fNumBytesWritten = uVar2 + this->fNumBytesWritten;
  }
  if (_bytePerSeconds->type == 'A') {
    local_50 = &this->fNumAudioFrames;
  }
  else {
    local_50 = &this->fNumVideoFrames;
  }
  *local_50 = *local_50 + 1;
  return;
}

Assistant:

void AviWriter::useFrame(const avi_frame_t &frame)
{
    if (frame.type == AVI_AUDIO_FRAME) {
        if (fPrevAudioPts) {
            int uSecondsDiff = frame.pts - fPrevAudioPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fAudioMaxBytesPerSecond)
                fAudioMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevAudioPts = frame.pts;
    } else {
        if (fPrevVideoPts) {
            int uSecondsDiff = frame.pts - fPrevVideoPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fVideoMaxBytesPerSecond)
                fVideoMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevVideoPts = frame.pts;
    }

    unsigned subsessionTag = (frame.type == AVI_AUDIO_FRAME ? fourChar('0', '1', 'w', 'b') : fourChar('0', '0', 'd', 'c'));

    auto indexRecord = new AVIIndexRecord;

    indexRecord->fChunkId = subsessionTag;
    int testIndex = (frame.type == AVI_AUDIO_FRAME ? 0 : 4);
    indexRecord->fFlags = frame.data[testIndex] == 0x67 ? 0x10 : 0;
    indexRecord->fOffset = 4 + fNumBytesWritten; // riff chunk header offset from movi chunk start (4 = movi)
    indexRecord->fSize = frame.size; // chunk size excluding riff header size (only frame data)

    indexRecords.push(indexRecord);

    fNumBytesWritten += addWord(subsessionTag);
    fNumBytesWritten += addWord(frame.size);

    fwrite(frame.data, 1, frame.size, fOutFid);
    fNumBytesWritten += frame.size;

    // Pad to an even length:

    if (frame.size % 2 == 0)
        fNumBytesWritten += addByte(0);

    (frame.type == AVI_AUDIO_FRAME ? fNumAudioFrames : fNumVideoFrames)++;
}